

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * kj::_::
       fill<kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                 (char *target,StringPtr *first,ArrayPtr<const_char> *rest,
                 ArrayPtr<const_char> *rest_1,ArrayPtr<const_char> *rest_2,
                 ArrayPtr<const_char> *rest_3,ArrayPtr<const_char> *rest_4,
                 ArrayPtr<const_char> *rest_5)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = (first->content).ptr;
  sVar1 = (first->content).size_;
  for (lVar3 = 0; sVar1 - 1 != lVar3; lVar3 = lVar3 + 1) {
    target[lVar3] = pcVar2[lVar3];
  }
  pcVar2 = fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                     (target + lVar3,rest,rest_1,rest_2,rest_3,rest_4,rest_5);
  return pcVar2;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}